

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_pathmatch.c
# Opt level: O0

wchar_t pm_list(char *start,char *end,char c,wchar_t flags)

{
  char *pcVar1;
  char rangeEnd;
  wchar_t nomatch;
  wchar_t match;
  char nextRangeStart;
  char rangeStart;
  char *p;
  wchar_t flags_local;
  char c_local;
  char *end_local;
  char *start_local;
  
  rangeStart = '\0';
  match = L'\x01';
  nomatch = L'\0';
  p = start;
  if (((*start == '!') || (*start == '^')) && (start < end)) {
    match = L'\0';
    nomatch = L'\x01';
    p = start + 1;
  }
  do {
    if (end <= p) {
      return nomatch;
    }
    nextRangeStart = '\0';
    if (*p == '-') {
      if ((rangeStart == '\0') || (p == end + -1)) {
        if (*p == c) {
          return match;
        }
      }
      else {
        rangeEnd = p[1];
        pcVar1 = p + 1;
        if (rangeEnd == '\\') {
          rangeEnd = p[2];
          pcVar1 = p + 2;
        }
        p = pcVar1;
        if ((rangeStart <= c) && (c <= rangeEnd)) {
          return match;
        }
      }
    }
    else {
      if (*p == '\\') {
        p = p + 1;
      }
      if (*p == c) {
        return match;
      }
      nextRangeStart = *p;
    }
    rangeStart = nextRangeStart;
    p = p + 1;
  } while( true );
}

Assistant:

static int
pm_list(const char *start, const char *end, const char c, int flags)
{
	const char *p = start;
	char rangeStart = '\0', nextRangeStart;
	int match = 1, nomatch = 0;

	/* This will be used soon... */
	(void)flags; /* UNUSED */

	/* If this is a negated class, return success for nomatch. */
	if ((*p == '!' || *p == '^') && p < end) {
		match = 0;
		nomatch = 1;
		++p;
	}

	while (p < end) {
		nextRangeStart = '\0';
		switch (*p) {
		case '-':
			/* Trailing or initial '-' is not special. */
			if ((rangeStart == '\0') || (p == end - 1)) {
				if (*p == c)
					return (match);
			} else {
				char rangeEnd = *++p;
				if (rangeEnd == '\\')
					rangeEnd = *++p;
				if ((rangeStart <= c) && (c <= rangeEnd))
					return (match);
			}
			break;
		case '\\':
			++p;
			/* Fall through */
		default:
			if (*p == c)
				return (match);
			nextRangeStart = *p; /* Possible start of range. */
		}
		rangeStart = nextRangeStart;
		++p;
	}
	return (nomatch);
}